

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::WriteMainCMakefile(cmGlobalUnixMakefileGenerator3 *this)

{
  cmOutputConverter *this_00;
  cmLocalGenerator *pcVar1;
  cmMakefile *pcVar2;
  bool bVar3;
  long lVar4;
  undefined8 uVar5;
  pointer pbVar6;
  char *pcVar7;
  ostream *poVar8;
  ulong uVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first;
  pointer ppcVar10;
  ulong uVar11;
  cmGlobalUnixMakefileGenerator3 *this_01;
  pointer pbVar12;
  string *remote_path;
  string tmpStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lfiles;
  string check;
  string currentBinDir;
  string binDir;
  string makefileName;
  string cmakefileName;
  cmGeneratedFileStream cmakefileStream;
  undefined1 local_388 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_368;
  string local_350;
  string local_330;
  string local_310;
  cmLocalGenerator *local_2f0;
  cmOutputConverter *local_2e8;
  string local_2e0;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *local_2c0;
  string local_2b8;
  _Base_ptr *local_298 [2];
  _Base_ptr local_288 [2];
  cmGeneratedFileStream local_278;
  
  pcVar7 = cmake::GetHomeOutputDirectory
                     ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance);
  std::__cxx11::string::string((string *)local_298,pcVar7,(allocator *)&local_278);
  std::__cxx11::string::append((char *)local_298);
  std::__cxx11::string::append((char *)local_298);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,(char *)local_298[0],false,None);
  if (((&local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.field_0x20)
       [(long)local_278.super_ofstream.super_basic_ostream<char,_std::char_traits<char>_>.
              _vptr_basic_ostream[-3]] & 5) == 0) {
    pcVar7 = cmake::GetHomeOutputDirectory
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    std::__cxx11::string::string((string *)&local_2b8,pcVar7,(allocator *)&local_330);
    std::__cxx11::string::append((char *)&local_2b8);
    cmLocalUnixMakefileGenerator3::WriteDisclaimer
              ((cmLocalUnixMakefileGenerator3 *)
               *(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
                super__Vector_impl_data._M_start,(ostream *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# The generator used is:\n",0x19);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_DEPENDS_GENERATOR \"",0x1d);
    (*(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator[3])
              (&local_330);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_330._M_dataplus._M_p,local_330._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\")\n\n",4);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
    local_368.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ppcVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar10) {
      uVar9 = 0;
      uVar11 = 1;
      do {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_368,
                   local_368.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                   (ppcVar10[uVar9]->Makefile->ListFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
                   (ppcVar10[uVar9]->Makefile->ListFiles).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish);
        ppcVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar11 < (ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator
                                       .LocalGenerators.
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar10
                                >> 3);
        uVar9 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar3);
    }
    pbVar6 = local_368.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar12 = local_368.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      uVar9 = (long)local_368.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_368.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar4 = 0x3f;
      if (uVar9 != 0) {
        for (; uVar9 >> lVar4 == 0; lVar4 = lVar4 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                (local_368.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
                 local_368.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar4 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_comp_iter<std::less<std::__cxx11::string>>>
                (pbVar12,pbVar6);
    }
    __first = std::
              __unique<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equal_to_iter>
                        (local_368.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,
                         local_368.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase(&local_368,(iterator)__first._M_current,
               (iterator)
               local_368.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    local_2c0 = &(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators;
    pcVar1 = *(local_2c0->
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory(pcVar1);
    std::__cxx11::string::string((string *)&local_330,pcVar7,(allocator *)&local_350);
    local_2f0 = pcVar1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,
               "# The top level Makefile was generated from the following files:\n",0x41);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_MAKEFILE_DEPENDS\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"  \"CMakeCache.txt\"\n",0x13);
    if (local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_368.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      this_00 = &local_2f0->super_cmOutputConverter;
      pbVar12 = local_368.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::ConvertToRelativePath(&local_350,this_00,&local_330,pbVar12);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_350._M_dataplus._M_p,
                            local_350._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_350._M_dataplus._M_p != &local_350.field_2) {
          operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
        }
        pbVar12 = pbVar12 + 1;
      } while (pbVar12 !=
               local_368.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n\n",5);
    pcVar7 = cmake::GetHomeOutputDirectory
                       ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.CMakeInstance)
    ;
    pcVar1 = local_2f0;
    std::__cxx11::string::string((string *)&local_350,pcVar7,(allocator *)&local_310);
    std::__cxx11::string::append((char *)&local_350);
    std::__cxx11::string::append((char *)&local_350);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# The corresponding makefile is:\n",0x21);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_MAKEFILE_OUTPUTS\n",0x1b);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
    local_2e8 = &pcVar1->super_cmOutputConverter;
    cmOutputConverter::ConvertToRelativePath(&local_310,local_2e8,&local_330,&local_2b8);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&local_278,local_310._M_dataplus._M_p,local_310._M_string_length)
    ;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"  \"",3);
    cmOutputConverter::ConvertToRelativePath((string *)local_388,local_2e8,&local_330,&local_350);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_388._0_8_,local_388._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
    if ((cmGlobalUnixMakefileGenerator3 *)local_388._0_8_ !=
        (cmGlobalUnixMakefileGenerator3 *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,CONCAT71(local_388._17_7_,local_388[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n\n",5);
    pcVar7 = cmLocalGenerator::GetBinaryDirectory(pcVar1);
    std::__cxx11::string::string((string *)&local_310,pcVar7,(allocator *)local_388);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"# Byproducts of CMake generate step:\n",0x25);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&local_278,"set(CMAKE_MAKEFILE_PRODUCTS\n",0x1c);
    pcVar2 = pcVar1->Makefile;
    remote_path = (pcVar2->OutputFiles).
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
    if (remote_path !=
        (pcVar2->OutputFiles).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::ConvertToRelativePath
                  ((string *)local_388,local_2e8,&local_310,remote_path);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,(char *)local_388._0_8_,local_388._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
        if ((cmGlobalUnixMakefileGenerator3 *)local_388._0_8_ !=
            (cmGlobalUnixMakefileGenerator3 *)(local_388 + 0x10)) {
          operator_delete((void *)local_388._0_8_,CONCAT71(local_388._17_7_,local_388[0x10]) + 1);
        }
        remote_path = remote_path + 1;
      } while (remote_path !=
               (pcVar2->OutputFiles).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
    local_388._0_8_ = local_388 + 0x10;
    local_388._8_8_ = (char *)0x0;
    local_388[0x10] = '\0';
    ppcVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
               super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    if ((this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
        super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppcVar10) {
      uVar9 = 0;
      uVar11 = 1;
      do {
        pcVar1 = ppcVar10[uVar9];
        pcVar7 = cmLocalGenerator::GetCurrentBinaryDirectory(pcVar1);
        uVar5 = local_388._8_8_;
        strlen(pcVar7);
        std::__cxx11::string::_M_replace((ulong)local_388,0,(char *)uVar5,(ulong)pcVar7);
        std::__cxx11::string::append((char *)local_388);
        std::__cxx11::string::append((char *)local_388);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  \"",3);
        cmOutputConverter::ConvertToRelativePath
                  (&local_2e0,&pcVar1->super_cmOutputConverter,&local_310,(string *)local_388);
        poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&local_278,local_2e0._M_dataplus._M_p,
                            local_2e0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\"\n",2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
          operator_delete(local_2e0._M_dataplus._M_p,local_2e0.field_2._M_allocated_capacity + 1);
        }
        ppcVar10 = (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.LocalGenerators.
                   super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        bVar3 = uVar11 < (ulong)((long)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator
                                       .LocalGenerators.
                                       super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                                       ._M_impl.super__Vector_impl_data._M_finish - (long)ppcVar10
                                >> 3);
        uVar9 = uVar11;
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (bVar3);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_278,"  )\n\n",5);
    this_01 = (cmGlobalUnixMakefileGenerator3 *)local_388._0_8_;
    if ((cmGlobalUnixMakefileGenerator3 *)local_388._0_8_ !=
        (cmGlobalUnixMakefileGenerator3 *)(local_388 + 0x10)) {
      operator_delete((void *)local_388._0_8_,CONCAT71(local_388._17_7_,local_388[0x10]) + 1);
    }
    WriteMainCMakefileLanguageRules(this_01,&local_278,local_2c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310._M_dataplus._M_p != &local_310.field_2) {
      operator_delete(local_310._M_dataplus._M_p,local_310.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_350._M_dataplus._M_p != &local_350.field_2) {
      operator_delete(local_350._M_dataplus._M_p,local_350.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
      operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
    }
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  if (local_298[0] != local_288) {
    operator_delete(local_298[0],(ulong)((long)&local_288[0]->_M_color + 1));
  }
  return;
}

Assistant:

void cmGlobalUnixMakefileGenerator3::WriteMainCMakefile()
{
  // Open the output file.  This should not be copy-if-different
  // because the check-build-system step compares the makefile time to
  // see if the build system must be regenerated.
  std::string cmakefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  cmakefileName += cmake::GetCMakeFilesDirectory();
  cmakefileName += "/Makefile.cmake";
  cmGeneratedFileStream cmakefileStream(cmakefileName.c_str());
  if (!cmakefileStream) {
    return;
  }

  std::string makefileName =
    this->GetCMakeInstance()->GetHomeOutputDirectory();
  makefileName += "/Makefile";

  // get a local generator for some useful methods
  cmLocalUnixMakefileGenerator3* lg =
    static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  // Write the do not edit header.
  lg->WriteDisclaimer(cmakefileStream);

  // Save the generator name
  cmakefileStream << "# The generator used is:\n"
                  << "set(CMAKE_DEPENDS_GENERATOR \"" << this->GetName()
                  << "\")\n\n";

  // for each cmMakefile get its list of dependencies
  std::vector<std::string> lfiles;
  for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
    lg = static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[i]);

    // Get the list of files contributing to this generation step.
    lfiles.insert(lfiles.end(), lg->GetMakefile()->GetListFiles().begin(),
                  lg->GetMakefile()->GetListFiles().end());
  }
  // Sort the list and remove duplicates.
  std::sort(lfiles.begin(), lfiles.end(), std::less<std::string>());
#if !defined(__VMS) // The Compaq STL on VMS crashes, so accept duplicates.
  std::vector<std::string>::iterator new_end =
    std::unique(lfiles.begin(), lfiles.end());
  lfiles.erase(new_end, lfiles.end());
#endif

  // reset lg to the first makefile
  lg = static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[0]);

  std::string currentBinDir = lg->GetCurrentBinaryDirectory();
  // Save the list to the cmake file.
  cmakefileStream
    << "# The top level Makefile was generated from the following files:\n"
    << "set(CMAKE_MAKEFILE_DEPENDS\n"
    << "  \"CMakeCache.txt\"\n";
  for (std::vector<std::string>::const_iterator i = lfiles.begin();
       i != lfiles.end(); ++i) {
    cmakefileStream << "  \"" << lg->ConvertToRelativePath(currentBinDir, *i)
                    << "\"\n";
  }
  cmakefileStream << "  )\n\n";

  // Build the path to the cache check file.
  std::string check = this->GetCMakeInstance()->GetHomeOutputDirectory();
  check += cmake::GetCMakeFilesDirectory();
  check += "/cmake.check_cache";

  // Set the corresponding makefile in the cmake file.
  cmakefileStream << "# The corresponding makefile is:\n"
                  << "set(CMAKE_MAKEFILE_OUTPUTS\n"
                  << "  \""
                  << lg->ConvertToRelativePath(currentBinDir, makefileName)
                  << "\"\n"
                  << "  \"" << lg->ConvertToRelativePath(currentBinDir, check)
                  << "\"\n";
  cmakefileStream << "  )\n\n";

  const std::string binDir = lg->GetBinaryDirectory();

  // CMake must rerun if a byproduct is missing.
  {
    cmakefileStream << "# Byproducts of CMake generate step:\n"
                    << "set(CMAKE_MAKEFILE_PRODUCTS\n";
    const std::vector<std::string>& outfiles =
      lg->GetMakefile()->GetOutputFiles();
    for (std::vector<std::string>::const_iterator k = outfiles.begin();
         k != outfiles.end(); ++k) {
      cmakefileStream << "  \"" << lg->ConvertToRelativePath(binDir, *k)
                      << "\"\n";
    }

    // add in all the directory information files
    std::string tmpStr;
    for (unsigned int i = 0; i < this->LocalGenerators.size(); ++i) {
      lg =
        static_cast<cmLocalUnixMakefileGenerator3*>(this->LocalGenerators[i]);
      tmpStr = lg->GetCurrentBinaryDirectory();
      tmpStr += cmake::GetCMakeFilesDirectory();
      tmpStr += "/CMakeDirectoryInformation.cmake";
      cmakefileStream << "  \"" << lg->ConvertToRelativePath(binDir, tmpStr)
                      << "\"\n";
    }
    cmakefileStream << "  )\n\n";
  }

  this->WriteMainCMakefileLanguageRules(cmakefileStream,
                                        this->LocalGenerators);
}